

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<int>::reject<QString>(PromiseResolver<int> *this,QString *error)

{
  QPromise<int> *pQVar1;
  Data *pDVar2;
  PromiseData<int> *pPVar3;
  QPromise<int> *promise;
  QString *error_local;
  PromiseResolver<int> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<int> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_>::operator->
                       (&(pQVar1->super_QPromiseBase<int>).m_d);
    PromiseDataBase<int,_void_(const_int_&)>::reject<QString>
              (&pPVar3->super_PromiseDataBase<int,_void_(const_int_&)>,error);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_>::operator->
                       (&(pQVar1->super_QPromiseBase<int>).m_d);
    PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<int,_void_(const_int_&)>);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }